

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void bothImplyNotNullRow(Walker *pWalker,Expr *pE1,Expr *pE2)

{
  if (pWalker->eCode == 0) {
    sqlite3WalkExpr(pWalker,pE1);
    if (pWalker->eCode != 0) {
      pWalker->eCode = 0;
      sqlite3WalkExpr(pWalker,pE2);
      return;
    }
  }
  return;
}

Assistant:

static void bothImplyNotNullRow(Walker *pWalker, Expr *pE1, Expr *pE2){
  if( pWalker->eCode==0 ){
    sqlite3WalkExpr(pWalker, pE1);
    if( pWalker->eCode ){
      pWalker->eCode = 0;
      sqlite3WalkExpr(pWalker, pE2);
    }
  }
}